

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O2

void __thiscall
BsplineCurve::BsplineCurve(BsplineCurve *this,vector<vec3f,_std::allocator<vec3f>_> *points)

{
  undefined8 *puVar1;
  _Vector_base<vec3f,_std::allocator<vec3f>_> local_30;
  
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)&local_30,points);
  Curve::Curve(&this->super_Curve,(vector<vec3f,_std::allocator<vec3f>_> *)&local_30);
  std::_Vector_base<vec3f,_std::allocator<vec3f>_>::~_Vector_base(&local_30);
  (this->super_Curve)._vptr_Curve = (_func_int **)&PTR_atParam_001604b0;
  if (3 < (ulong)(((long)(points->super__Vector_base<vec3f,_std::allocator<vec3f>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(points->super__Vector_base<vec3f,_std::allocator<vec3f>_>)._M_impl.
                        super__Vector_impl_data._M_start) / 0xc)) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "Number of control points of BspineCurve must be more than 4!";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

BsplineCurve(const std::vector<vec3f> &points) : Curve(points) {
        if (points.size() < 4) {
            throw "Number of control points of BspineCurve must be more than 4!";
        }
    }